

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O3

bool __thiscall
ithipublisher::GetNameOrNumberList
          (ithipublisher *this,char *metric_name,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,bool is_number)

{
  pointer *pp_Var1;
  pointer pp_Var2;
  iterator iVar3;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  __first;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000009;
  _metric_name_line *p_Var8;
  _metric_name_line *p_Var9;
  pointer pp_Var10;
  ulong uVar11;
  _metric_name_line *p_Var12;
  _metric_line *p_Var13;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  _Var14;
  _metric_name_line *p_Var15;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  _Var16;
  ulong uVar17;
  char *pcVar18;
  size_t __n;
  double dVar19;
  value_type __val;
  char *local_90;
  _metric_name_line local_78;
  char *local_58;
  double dStack_50;
  double local_48;
  _metric_name_line *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,is_number);
  local_78.name = (char *)0x0;
  local_78.current = 0.0;
  local_78.average = 0.0;
  pp_Var10 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pp_Var2 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)pp_Var2 - (long)pp_Var10 >> 3;
  if (pp_Var2 == pp_Var10) {
    local_90 = (char *)0x0;
    uVar11 = 0;
LAB_00198827:
    dVar19 = 0.0;
    pcVar18 = local_90;
    if (uVar11 < uVar17) {
      do {
        p_Var13 = pp_Var10[uVar11];
        iVar6 = strcmp(p_Var13->metric_name,metric_name);
        if (iVar6 != 0) break;
        if (local_90 == (char *)0x0) {
          local_90 = (char *)0x0;
        }
        else {
          iVar6 = strcmp(p_Var13->key_value,local_90);
          if (iVar6 != 0) {
            if (1 < (long)this->nb_months) {
              local_78.average = dVar19 / (double)((long)this->nb_months + -1);
            }
            iVar3._M_current =
                 (name_list->
                 super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (name_list->
                super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<_metric_name_line,std::allocator<_metric_name_line>>::
              _M_realloc_insert<_metric_name_line_const&>
                        ((vector<_metric_name_line,std::allocator<_metric_name_line>> *)name_list,
                         iVar3,&local_78);
            }
            else {
              (iVar3._M_current)->average = local_78.average;
              (iVar3._M_current)->name = local_78.name;
              (iVar3._M_current)->current = local_78.current;
              pp_Var1 = &(name_list->
                         super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *pp_Var1 = *pp_Var1 + 1;
            }
            pp_Var10 = (this->line_list).
                       super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_90 = pp_Var10[uVar11]->key_value;
            local_78.current = 0.0;
            local_78.average = 0.0;
            p_Var13 = pp_Var10[uVar11];
            dVar19 = 0.0;
            pcVar18 = local_90;
            local_78.name = local_90;
          }
        }
        if ((p_Var13->year == this->last_year) && (p_Var13->month == this->last_month)) {
          local_78.current = p_Var13->frequency;
        }
        else {
          dVar19 = dVar19 + p_Var13->frequency;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(this->line_list).
                                      super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var10 >>
                               3));
    }
    if (pcVar18 != (char *)0x0) {
      if (1 < (long)this->nb_months) {
        local_78.average = dVar19 / (double)((long)this->nb_months + -1);
      }
      iVar3._M_current =
           (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<_metric_name_line,std::allocator<_metric_name_line>>::
        _M_realloc_insert<_metric_name_line_const&>
                  ((vector<_metric_name_line,std::allocator<_metric_name_line>> *)name_list,iVar3,
                   &local_78);
      }
      else {
        (iVar3._M_current)->average = local_78.average;
        (iVar3._M_current)->name = local_78.name;
        (iVar3._M_current)->current = local_78.current;
        pp_Var1 = &(name_list->
                   super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
    }
  }
  else {
    local_90 = (char *)0x0;
    uVar11 = 0;
    do {
      p_Var13 = pp_Var10[uVar11];
      iVar6 = strcmp(p_Var13->metric_name,metric_name);
      if (0 < iVar6) goto LAB_00198827;
      if (iVar6 == 0) {
        local_90 = p_Var13->key_value;
        local_78.name = local_90;
        goto LAB_00198827;
      }
      uVar11 = uVar11 + 1;
    } while (uVar17 + (uVar17 == 0) != uVar11);
  }
  __first._M_current =
       (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
       _M_impl.super__Vector_impl_data._M_start;
  _Var16._M_current =
       (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if ((char)local_34 == '\0') {
    if (__first._M_current != _Var16._M_current) {
      uVar17 = ((long)_Var16._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
      lVar5 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
                (__first,_Var16,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x1961e2);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
                (__first,_Var16,
                 (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x1961e2);
    }
  }
  else if (__first._M_current != _Var16._M_current) {
    uVar17 = ((long)_Var16._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
              (__first,_Var16,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x196236);
    local_40 = _Var16._M_current;
    if ((long)_Var16._M_current - (long)__first._M_current < 0x181) {
      p_Var12 = __first._M_current + 1;
      _Var14._M_current = __first._M_current;
      if (__first._M_current + 1 != _Var16._M_current) {
        do {
          p_Var15 = p_Var12;
          pcVar18 = (__first._M_current)->name;
          pcVar4 = _Var14._M_current[1].name;
          iVar6 = atoi(pcVar4);
          iVar7 = atoi(pcVar18);
          if (iVar6 < iVar7) {
            local_48 = p_Var15->average;
            local_58 = p_Var15->name;
            dStack_50 = p_Var15->current;
            memmove((void *)((long)_Var14._M_current +
                            (0x30 - ((long)p_Var15 - (long)__first._M_current))),__first._M_current,
                    (long)p_Var15 - (long)__first._M_current);
            (__first._M_current)->name = local_58;
            (__first._M_current)->current = dStack_50;
            (__first._M_current)->average = local_48;
          }
          else {
            local_58 = (char *)p_Var15->current;
            dStack_50 = p_Var15->average;
            iVar7 = atoi((_Var14._M_current)->name);
            p_Var9 = p_Var15;
            p_Var12 = p_Var15;
            if (iVar6 < iVar7) {
              do {
                p_Var12 = p_Var9 + -1;
                p_Var9->average = p_Var9[-1].average;
                dVar19 = p_Var9[-1].current;
                p_Var9->name = p_Var9[-1].name;
                p_Var9->current = dVar19;
                pcVar18 = p_Var9[-2].name;
                iVar6 = atoi(pcVar4);
                iVar7 = atoi(pcVar18);
                p_Var9 = p_Var12;
              } while (iVar6 < iVar7);
            }
            p_Var12->name = pcVar4;
            p_Var12->current = (double)local_58;
            p_Var12->average = dStack_50;
          }
          p_Var12 = p_Var15 + 1;
          _Var14._M_current = p_Var15;
        } while (p_Var15 + 1 != local_40);
      }
    }
    else {
      __n = 0x18;
      _Var14._M_current = __first._M_current;
      _Var16._M_current = __first._M_current;
      do {
        _Var16._M_current = _Var16._M_current + 1;
        p_Var12 = (_metric_name_line *)((long)&(__first._M_current)->name + __n);
        pcVar18 = (__first._M_current)->name;
        pcVar4 = *(char **)((long)&(__first._M_current)->name + __n);
        iVar6 = atoi(pcVar4);
        iVar7 = atoi(pcVar18);
        if (iVar6 < iVar7) {
          local_48 = p_Var12->average;
          local_58 = p_Var12->name;
          dStack_50 = p_Var12->current;
          memmove((void *)((long)_Var14._M_current + (0x30 - __n)),__first._M_current,__n);
          (__first._M_current)->name = local_58;
          (__first._M_current)->current = dStack_50;
          (__first._M_current)->average = local_48;
        }
        else {
          local_58 = (char *)p_Var12->current;
          dStack_50 = p_Var12->average;
          iVar7 = atoi((_Var14._M_current)->name);
          p_Var9 = _Var16._M_current;
          p_Var15 = p_Var12;
          if (iVar6 < iVar7) {
            do {
              p_Var15 = p_Var9 + -1;
              p_Var9->average = p_Var9[-1].average;
              dVar19 = p_Var9[-1].current;
              p_Var9->name = p_Var9[-1].name;
              p_Var9->current = dVar19;
              pcVar18 = p_Var9[-2].name;
              iVar6 = atoi(pcVar4);
              iVar7 = atoi(pcVar18);
              p_Var9 = p_Var15;
            } while (iVar6 < iVar7);
          }
          p_Var15->name = pcVar4;
          p_Var15->current = (double)local_58;
          p_Var15->average = dStack_50;
        }
        p_Var15 = local_40;
        __n = __n + 0x18;
        _Var14._M_current = p_Var12;
      } while (__n != 0x180);
      for (p_Var12 = __first._M_current + 0x10; p_Var12 != p_Var15; p_Var12 = p_Var12 + 1) {
        pcVar18 = p_Var12->name;
        local_58 = (char *)p_Var12->current;
        dStack_50 = p_Var12->average;
        pcVar4 = p_Var12[-1].name;
        iVar6 = atoi(pcVar18);
        iVar7 = atoi(pcVar4);
        p_Var8 = p_Var12;
        p_Var9 = p_Var12;
        if (iVar6 < iVar7) {
          do {
            p_Var9 = p_Var8 + -1;
            p_Var8->average = p_Var8[-1].average;
            dVar19 = p_Var8[-1].current;
            p_Var8->name = p_Var8[-1].name;
            p_Var8->current = dVar19;
            pcVar4 = p_Var8[-2].name;
            iVar6 = atoi(pcVar18);
            iVar7 = atoi(pcVar4);
            p_Var8 = p_Var9;
          } while (iVar6 < iVar7);
        }
        p_Var9->name = pcVar18;
        p_Var9->current = (double)local_58;
        p_Var9->average = dStack_50;
      }
    }
  }
  return true;
}

Assistant:

bool ithipublisher::GetNameOrNumberList(char const * metric_name, std::vector<MetricNameLine>* name_list, bool is_number)
{
    size_t line_index = 0;
    double sum = 0;
    MetricNameLine current_name = { NULL, 0, 0 };

    /* Skip to beginning of the metric */
    while (line_index < line_list.size())
    {
        int cmp = strcmp(line_list[line_index]->metric_name, metric_name);

        if (cmp > 0)
        {
            break;
        }
        else if (cmp == 0)
        {
            current_name.name = line_list[line_index]->key_value;
            break;
        }
        line_index++;
    }

    /* Extract the lines and compute the averages */
    while (line_index < line_list.size() && strcmp(line_list[line_index]->metric_name, metric_name) == 0)
    {
        if (current_name.name != NULL && strcmp(line_list[line_index]->key_value, current_name.name) != 0)
        {
            if (nb_months > 1)
            {
                current_name.average = sum / (((size_t)nb_months) - 1);
            }
            name_list->push_back(current_name);
            current_name.name = line_list[line_index]->key_value;
            current_name.average = 0;
            current_name.current = 0;
            sum = 0;
        }
        
        if (line_list[line_index]->year == last_year &&
            line_list[line_index]->month == last_month)
        {
            current_name.current = line_list[line_index]->frequency;
        }
        else
        {
            sum += line_list[line_index]->frequency;
        }

        line_index++;
    }
    /* Push the last entry if it was filled up */
    if (current_name.name != NULL)
    {
        if (nb_months > 1)
        {
            current_name.average = sum / (((size_t)nb_months) - 1);
        }
        name_list->push_back(current_name);
    }

    if (is_number) {
        /* Sort by increasing metric number */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNumberIsLower);
    } else {
        /* Sort from bigger to lower */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNameLineIsBigger);
    }

    return true;
}